

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O0

void __thiscall
bvh_node::bvh_node(bvh_node *this,
                  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                  *objects,size_t start,size_t end,double time0,double time1)

{
  aabb box0;
  aabb box1;
  byte bVar1;
  undefined1 uVar2;
  uint uVar3;
  reference pvVar4;
  shared_ptr<hittable> *psVar5;
  element_type *peVar6;
  undefined6 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdee;
  code *local_1e8;
  code *local_1e0;
  undefined1 local_150 [48];
  undefined1 auStack_120 [8];
  aabb box_right;
  aabb box_left;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> local_b0;
  size_t mid;
  shared_ptr<hittable> *local_90;
  __normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
  local_88;
  __normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
  local_80;
  shared_ptr<hittable> local_78;
  shared_ptr<hittable> local_68;
  ulong local_58;
  size_t object_span;
  _func_bool_shared_ptr<hittable>_shared_ptr<hittable> *comparator;
  int axis;
  double local_38;
  double time1_local;
  double time0_local;
  size_t end_local;
  size_t start_local;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *objects_local;
  bvh_node *this_local;
  
  local_38 = time1;
  time1_local = time0;
  time0_local = (double)end;
  end_local = start;
  start_local = (size_t)objects;
  objects_local =
       (vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *)this;
  hittable::hittable(&this->super_hittable);
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0015ff58;
  std::shared_ptr<hittable>::shared_ptr(&this->left);
  std::shared_ptr<hittable>::shared_ptr(&this->right);
  aabb::aabb(&this->box);
  comparator._0_4_ = random_int(0,2);
  if ((int)comparator == 0) {
    local_1e0 = box_x_compare;
  }
  else {
    if ((int)comparator == 1) {
      local_1e8 = box_y_compare;
    }
    else {
      local_1e8 = box_z_compare;
    }
    local_1e0 = local_1e8;
  }
  object_span = (size_t)local_1e0;
  local_58 = (long)time0_local - end_local;
  if (local_58 == 1) {
    pvVar4 = std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
             operator[]((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                         *)start_local,end_local);
    psVar5 = std::shared_ptr<hittable>::operator=(&this->right,pvVar4);
    std::shared_ptr<hittable>::operator=(&this->left,psVar5);
  }
  else if (local_58 == 2) {
    pvVar4 = std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
             operator[]((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                         *)start_local,end_local);
    std::shared_ptr<hittable>::shared_ptr(&local_68,pvVar4);
    pvVar4 = std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
             operator[]((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                         *)start_local,end_local + 1);
    std::shared_ptr<hittable>::shared_ptr(&local_78,pvVar4);
    bVar1 = (*local_1e0)(&local_68,&local_78);
    std::shared_ptr<hittable>::~shared_ptr(&local_78);
    std::shared_ptr<hittable>::~shared_ptr(&local_68);
    if ((bVar1 & 1) == 0) {
      pvVar4 = std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
               operator[]((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                           *)start_local,end_local + 1);
      std::shared_ptr<hittable>::operator=(&this->left,pvVar4);
      pvVar4 = std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
               operator[]((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                           *)start_local,end_local);
      std::shared_ptr<hittable>::operator=(&this->right,pvVar4);
    }
    else {
      pvVar4 = std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
               operator[]((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                           *)start_local,end_local);
      std::shared_ptr<hittable>::operator=(&this->left,pvVar4);
      pvVar4 = std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
               operator[]((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                           *)start_local,end_local + 1);
      std::shared_ptr<hittable>::operator=(&this->right,pvVar4);
    }
  }
  else {
    local_88._M_current =
         (shared_ptr<hittable> *)
         std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::begin
                   ((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                     *)start_local);
    local_80 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
               ::operator+(&local_88,end_local);
    mid = (size_t)std::
                  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
                  begin((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                         *)start_local);
    local_90 = (shared_ptr<hittable> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
               ::operator+((__normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
                            *)&mid,(difference_type)time0_local);
    std::
    sort<__gnu_cxx::__normal_iterator<std::shared_ptr<hittable>*,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>>,bool(*)(std::shared_ptr<hittable>,std::shared_ptr<hittable>)>
              (local_80,(__normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
                         )local_90,
               (_func_bool_shared_ptr<hittable>_shared_ptr<hittable> *)object_span);
    local_b0.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(end_local + (local_58 >> 1));
    std::
    make_shared<bvh_node,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>&,unsigned_long&,unsigned_long&,double&,double&>
              (&local_b0,(unsigned_long *)start_local,&end_local,
               (double *)
               &local_b0.
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&time1_local);
    std::shared_ptr<hittable>::operator=(&this->left,(shared_ptr<bvh_node> *)&local_b0);
    std::shared_ptr<bvh_node>::~shared_ptr((shared_ptr<bvh_node> *)&local_b0);
    std::
    make_shared<bvh_node,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>&,unsigned_long&,unsigned_long&,double&,double&>
              ((vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *)
               (box_left._max.e + 2),(unsigned_long *)start_local,
               (unsigned_long *)
               &local_b0.
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&time0_local,&time1_local);
    std::shared_ptr<hittable>::operator=(&this->right,(shared_ptr<bvh_node> *)(box_left._max.e + 2))
    ;
    std::shared_ptr<bvh_node>::~shared_ptr((shared_ptr<bvh_node> *)(box_left._max.e + 2));
  }
  aabb::aabb((aabb *)(box_right._max.e + 2));
  aabb::aabb((aabb *)auStack_120);
  peVar6 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->left);
  uVar3 = (*peVar6->_vptr_hittable[1])
                    (SUB84(time1_local,0),SUB84(local_38,0),peVar6,box_right._max.e + 2);
  uVar2 = (undefined1)uVar3;
  if ((uVar3 & 1) != 0) {
    peVar6 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->right);
    uVar3 = (*peVar6->_vptr_hittable[1])(SUB84(time1_local,0),SUB84(local_38,0),peVar6,auStack_120);
    in_stack_fffffffffffffdee = (undefined1)uVar3;
    if ((uVar3 & 1) != 0) goto LAB_00106b53;
  }
  std::operator<<((ostream *)&std::cerr,"No bounding box in bvh_node constructor.\n");
LAB_00106b53:
  box0._min.e[1] = box_left._min.e[1];
  box0._min.e[0] = box_left._min.e[0];
  box0._min.e[2] = box_left._min.e[2];
  box0._max.e[0] = box_left._max.e[0];
  box0._max.e[1] = box_left._max.e[1];
  box0._max.e[2] = (double)auStack_120;
  box1._min.e[1] = box_right._min.e[1];
  box1._min.e[0] = box_right._min.e[0];
  box1._min.e[2] = box_right._min.e[2];
  box1._max.e[0] = box_right._max.e[0];
  box1._max.e[1] = box_right._max.e[1];
  box1._max.e[2]._0_6_ = in_stack_fffffffffffffde8;
  box1._max.e[2]._6_1_ = in_stack_fffffffffffffdee;
  box1._max.e[2]._7_1_ = uVar2;
  surrounding_box(box0,box1);
  memcpy(&this->box,local_150,0x30);
  return;
}

Assistant:

bvh_node::bvh_node(
        std::vector<shared_ptr<hittable>>& objects,
        size_t start, size_t end, double time0, double time1
) {
    int axis = random_int(0,2);
    auto comparator = (axis == 0) ? box_x_compare
                    : (axis == 1) ? box_y_compare
                                  : box_z_compare;

    size_t object_span = end - start;

    if (object_span == 1) {
        left = right = objects[start];
    } else if (object_span == 2) {
        if (comparator(objects[start], objects[start+1])) {
            left = objects[start];
            right = objects[start+1];
        } else {
            left = objects[start+1];
            right = objects[start];
        }
    } else {
        std::sort(objects.begin() + start, objects.begin() + end, comparator);

        auto mid = start + object_span/2;
        left = make_shared<bvh_node>(objects, start, mid, time0, time1);
        right = make_shared<bvh_node>(objects, mid, end, time0, time1);
    }

    aabb box_left, box_right;

    if (  !left->bounding_box (time0, time1, box_left)
          || !right->bounding_box(time0, time1, box_right)
            )
        std::cerr << "No bounding box in bvh_node constructor.\n";

    box = surrounding_box(box_left, box_right);
}